

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_seq_cst.h
# Opt level: O2

uintptr_t __thiscall
density::detail::
LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::page_overflow(LFQueue_Tail<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                *this,LfQueue_ProgressGuarantee i_progress_guarantee,uintptr_t i_tail)

{
  ulong uVar1;
  ControlBlock *pCVar2;
  ControlBlock *pCVar3;
  ulong uVar4;
  ControlBlock *pCVar5;
  bool bVar6;
  
  if (i_progress_guarantee != LfQueue_WaitFree) {
    uVar1 = (i_tail | 0xffc0) - i_tail;
    if (uVar1 == 0) {
      pCVar2 = get_or_allocate_next_page(this,i_progress_guarantee,(ControlBlock *)i_tail);
    }
    else {
      uVar1 = uVar1 >> 6;
      uVar4 = 0x3f;
      if (uVar1 < 0x3f) {
        uVar4 = uVar1;
      }
      pCVar3 = (ControlBlock *)(uVar4 | i_tail);
      LOCK();
      pCVar2 = (ControlBlock *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
      bVar6 = (ControlBlock *)i_tail == pCVar2;
      if (bVar6) {
        (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pCVar3;
        pCVar2 = (ControlBlock *)i_tail;
      }
      UNLOCK();
      if (bVar6) {
        pCVar5 = (ControlBlock *)(uVar4 * 0x40 + i_tail);
        raw_atomic_store((uintptr_t *)i_tail,uVar4 * 0x40 + i_tail + 2,memory_order_seq_cst);
        LOCK();
        pCVar2 = (ControlBlock *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar6 = pCVar3 == pCVar2;
        if (bVar6) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)pCVar5;
          pCVar2 = pCVar3;
        }
        UNLOCK();
        if (bVar6) {
          pCVar2 = pCVar5;
        }
      }
    }
    return (uintptr_t)pCVar2;
  }
  return 0;
}

Assistant:

DENSITY_NO_INLINE uintptr_t
                              page_overflow(LfQueue_ProgressGuarantee i_progress_guarantee, uintptr_t const i_tail)
            {
                DENSITY_ASSUME_UINT_ALIGNED(i_tail, s_alloc_granularity);

                // the memory protection currently used (pinning) is based on an atomic increment, that is not wait-free
                if (i_progress_guarantee == LfQueue_WaitFree)
                {
                    return 0;
                }

                auto const page_end = reinterpret_cast<uintptr_t>(
                  get_end_control_block(reinterpret_cast<void *>(i_tail)));
                if (i_tail < page_end)
                {
                    /* There is space between the (presumed) current tail and the end control block.
                        We try to pad it with a dead element. */
                    auto const uinits =
                      size_min((page_end - i_tail) / s_alloc_granularity, s_alloc_granularity - 1);
                    auto       expected_tail  = i_tail;
                    auto       transient_tail = i_tail + uinits;
                    auto const future_tail    = i_tail + uinits * s_alloc_granularity;
                    if (m_tail.compare_exchange_weak(
                          expected_tail, transient_tail, mem_relaxed, mem_relaxed))
                    {
                        // m_tail was successfully updated, now we can setup the padding element
                        auto const block = reinterpret_cast<ControlBlock *>(i_tail);
                        raw_atomic_store(&block->m_next, future_tail + LfQueue_Dead, mem_relaxed);
                        expected_tail = transient_tail;
                        if (m_tail.compare_exchange_strong(
                              expected_tail, future_tail, mem_relaxed, mem_relaxed))
                        {
                            return future_tail;
                        }
                    }

                    // we have in expected_tail an updated value of m_tail
                    return expected_tail;
                }
                else
                {
                    // get or allocate a new page
                    DENSITY_ASSUME(i_tail == page_end);
                    return reinterpret_cast<uintptr_t>(get_or_allocate_next_page(
                      i_progress_guarantee, reinterpret_cast<ControlBlock *>(i_tail)));
                }
            }